

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentImageAtomicCase::iterate
          (ConcurrentImageAtomicCase *this)

{
  ulong uVar1;
  ostringstream *poVar2;
  ostringstream *this_00;
  pointer puVar3;
  pointer puVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  GLenum GVar8;
  GLint GVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectTraits *traits;
  void *pvVar12;
  ulong uVar13;
  TestError *pTVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  int invalidOperationNdx;
  Buffer resultBuffer;
  deUint32 errorExpected;
  deUint32 errorDelta;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainDelta;
  vector<int,_std::allocator<int>_> deltas;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  ulong local_220;
  int local_214;
  ObjectWrapper local_210;
  deUint32 local_1f8;
  deUint32 local_1f4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  vector<int,_std::allocator<int>_> local_1d8;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *pFVar11;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar11 = (Functions *)CONCAT44(extraout_var,iVar7);
  uVar16 = this->m_numCalls;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  generateShuffledRamp(uVar16,&local_1d8);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Clearing image contents",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  (*pFVar11->useProgram)((this->m_imageClearProgram->m_program).m_program);
  (*pFVar11->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88b9,0x8236);
  (*pFVar11->dispatchCompute)(this->m_workSize,this->m_workSize,1);
  (*pFVar11->memoryBarrier)(0x20);
  GVar8 = (*pFVar11->getError)();
  glu::checkError(GVar8,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xaae);
  GVar9 = (*pFVar11->getUniformLocation)((this->m_program->m_program).m_program,"u_atomicDelta");
  local_220 = CONCAT44(local_220._4_4_,GVar9);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Running shader ",0xf);
  std::ostream::operator<<(poVar2,this->m_numCalls);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," times.\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Num groups = (",0xe);
  std::ostream::operator<<(poVar2,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
  std::ostream::operator<<(poVar2,this->m_workSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", 1)\n",5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Setting u_atomicDelta to a unique value for each call.\n",0x37);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if ((int)local_220 == -1) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"u_atomicDelta location was -1","");
    tcu::TestError::TestError(pTVar14,(string *)local_1b0);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar11->useProgram)((this->m_program->m_program).m_program);
  (*pFVar11->bindImageTexture)(2,this->m_imageID,0,'\0',0,0x88ba,0x8236);
  local_1b8 = (ulong)uVar16;
  if (0 < this->m_numCalls) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    lVar19 = 0;
    do {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Call ",5);
      std::ostream::operator<<(poVar2,(int)lVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,": u_atomicDelta = ",0x12);
      std::ostream::operator<<
                (poVar2,local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar19]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      (*pFVar11->uniform1ui)
                ((int)local_220,
                 local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar19]);
      (*pFVar11->bindBufferBase)
                (0x90d2,1,(this->m_intermediateResultBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar19]);
      (*pFVar11->dispatchCompute)(this->m_workSize,this->m_workSize,1);
      lVar19 = lVar19 + 1;
    } while (lVar19 < this->m_numCalls);
  }
  GVar8 = (*pFVar11->getError)();
  uVar18 = local_1b8;
  glu::checkError(GVar8,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xace);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Verifying work image, it should be filled with value ",0x35);
  uVar16 = (((int)uVar18 + 1) * (int)uVar18) / 2;
  local_220 = (ulong)uVar16;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var_00,iVar7);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_210,(Functions *)CONCAT44(extraout_var_01,iVar7),traits);
  local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0,
             (long)(this->m_workSize * this->m_workSize),(value_type_conflict4 *)&local_1f0,
             (allocator_type *)&local_214);
  (**(code **)(lVar19 + 0x40))(0x90d2,local_210.m_object);
  (**(code **)(lVar19 + 0x150))
            (0x90d2,(long)(this->m_workSize * this->m_workSize * 4),local_1b0._0_8_,0x88ea);
  (**(code **)(lVar19 + 0xdb8))(0x20);
  (**(code **)(lVar19 + 0x1680))((this->m_imageReadProgram->m_program).m_program);
  (**(code **)(lVar19 + 0x48))(0x90d2,1,local_210.m_object);
  (**(code **)(lVar19 + 0x80))(2,this->m_imageID,0,0,0,35000,0x8236);
  (**(code **)(lVar19 + 0x528))(this->m_workSize,this->m_workSize,1);
  dVar10 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar10,"read",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb40);
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)0x0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity - local_1b0._0_8_);
  }
  pvVar12 = (void *)(**(code **)(lVar19 + 0xd00))
                              (0x90d2,0,(long)(this->m_workSize * this->m_workSize * 4),1);
  dVar10 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar10,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0xb46);
  if (pvVar12 == (void *)0x0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"mapBufferRange returned NULL","");
    tcu::TestError::TestError(pTVar14,(string *)local_1b0);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_238,(long)(this->m_workSize * this->m_workSize));
  memcpy(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar12,
         (long)this->m_workSize * (long)this->m_workSize * 4);
  cVar5 = (**(code **)(lVar19 + 0x1670))(0x90d2);
  if (cVar5 == '\0') {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"unmapBuffer returned false","");
    tcu::TestError::TestError(pTVar14,(string *)local_1b0);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_210);
  uVar15 = this->m_workSize * this->m_workSize;
  if (0 < (int)uVar15) {
    uVar18 = 0;
    do {
      if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] != uVar16) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Work image error, at index (",0x1c);
        uVar16 = (int)uVar18 >> 0x1f;
        std::ostream::operator<<
                  (poVar2,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) %
                               (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
        std::ostream::operator<<
                  (poVar2,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) /
                               (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,") expected value ",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", got ",6);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Work image contains invalid values.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image contents invalid");
        if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_014d273e;
      }
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Work image contents are valid.",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&local_210,(long)this->m_numCalls,(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_238,(long)this->m_numCalls,(allocator_type *)local_1b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1f0,(long)this->m_numCalls,(allocator_type *)local_1b0);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Verifying intermediate results. ",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (0 < this->m_numCalls) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      (*pFVar11->bindBuffer)
                (0x90d2,(this->m_intermediateResultBuffers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar19]);
      readBuffer(pFVar11,0x90d2,this->m_workSize * this->m_workSize,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(local_210.m_gl)->activeShaderProgram + lVar20));
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x18;
    } while (lVar19 < this->m_numCalls);
  }
  if (0 < this->m_workSize) {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    uVar18 = 0;
    do {
      puVar4 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = (ulong)(uint)this->m_numCalls;
      if (0 < this->m_numCalls) {
        lVar19 = 0;
        pFVar11 = local_210.m_gl;
        do {
          local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar19] =
               *(uint *)(pFVar11->activeShaderProgram + uVar18 * 4);
          lVar19 = lVar19 + 1;
          uVar13 = (ulong)this->m_numCalls;
          pFVar11 = (Functions *)&pFVar11->beginConditionalRender;
        } while (lVar19 < (long)uVar13);
      }
      if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar13 = (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        lVar19 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start,
                   local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar4);
        uVar13 = (ulong)(uint)this->m_numCalls;
      }
      puVar4 = local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (0 < (int)uVar13) {
        uVar17 = 0;
        do {
          uVar1 = uVar17 + 1;
          uVar15 = uVar16;
          if (uVar1 != (uVar13 & 0xffffffff)) {
            uVar15 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar17 + 1];
          }
          *(uint *)(CONCAT44(local_1f0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             local_1f0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_4_) + uVar17 * 4) =
               uVar15 - local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17];
          uVar13 = (ulong)this->m_numCalls;
          uVar17 = uVar1;
        } while ((long)uVar1 < (long)uVar13);
      }
      puVar3 = (pointer)CONCAT44(local_1f0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_1f0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (puVar3 != local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        uVar13 = (long)local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
        lVar19 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3,local_1f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e
                  );
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3,puVar4);
      }
      bVar6 = validateSortedAtomicRampAdditionValueChain
                        (&local_238,uVar16,&local_214,&local_1f4,&local_1f8);
      if (!bVar6) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Intermediate buffer error, at index (",0x25);
        uVar16 = (int)uVar18 >> 0x1f;
        std::ostream::operator<<
                  (this_00,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) %
                                (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<
                  (this_00,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) /
                                (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"), applied operation index ",0x1b);
        std::ostream::operator<<(this_00,local_214);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,", value was increased by ",0x19);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", but expected ",0xf)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "Intermediate buffer contains invalid values. Values at index (",0x3e);
        std::ostream::operator<<
                  (this_00,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) %
                                (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<
                  (this_00,(int)((long)((ulong)uVar16 << 0x20 | uVar18 & 0xffffffff) /
                                (long)this->m_workSize));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        if (0 < this->m_numCalls) {
          lVar19 = 0;
          do {
            local_1b0._0_8_ =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Value[",6);
            std::ostream::operator<<(poVar2,(int)lVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"] = ",4);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_138);
            lVar19 = lVar19 + 1;
          } while (lVar19 < this->m_numCalls);
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Result = ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Buffer contents invalid");
        pvVar12 = (void *)CONCAT44(local_1f0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_1f0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_);
        if (pvVar12 != (void *)0x0) {
          operator_delete(pvVar12,(long)local_1f0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar12);
        }
        if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&local_210);
        goto LAB_014d273e;
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)this->m_workSize);
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Intermediate buffers are valid.",0x1f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  pvVar12 = (void *)CONCAT44(local_1f0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             local_1f0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_4_);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_1f0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar12)
    ;
  }
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_210);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_014d273e:
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

TestCase::IterateResult ConcurrentImageAtomicCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const deUint32			sumValue		= (deUint32)(m_numCalls * (m_numCalls + 1) / 2);
	std::vector<int>		deltas;

	// generate unique deltas
	generateShuffledRamp(m_numCalls, deltas);

	// clear image
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Clearing image contents" << tcu::TestLog::EndMessage;

		gl.useProgram(m_imageClearProgram->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		gl.dispatchCompute(m_workSize, m_workSize, 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");
	}

	// invoke program N times, each with a different delta
	{
		const int deltaLocation = gl.getUniformLocation(m_program->getProgram(), "u_atomicDelta");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Running shader " << m_numCalls << " times.\n"
			<< "Num groups = (" << m_workSize << ", " << m_workSize << ", 1)\n"
			<< "Setting u_atomicDelta to a unique value for each call.\n"
			<< tcu::TestLog::EndMessage;

		if (deltaLocation == -1)
			throw tcu::TestError("u_atomicDelta location was -1");

		gl.useProgram(m_program->getProgram());
		gl.bindImageTexture(2, m_imageID, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Call " << callNdx << ": u_atomicDelta = " << deltas[callNdx]
				<< tcu::TestLog::EndMessage;

			gl.uniform1ui(deltaLocation, deltas[callNdx]);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_intermediateResultBuffers[callNdx]);
			gl.dispatchCompute(m_workSize, m_workSize, 1);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "post dispatch");
	}

	// Verify result
	{
		std::vector<deUint32> result;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying work image, it should be filled with value " << sumValue << tcu::TestLog::EndMessage;

		readWorkImage(result);

		for (int ndx = 0; ndx < m_workSize * m_workSize; ++ndx)
		{
			if (result[ndx] != sumValue)
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Work image error, at index (" << ndx % m_workSize << ", " << ndx / m_workSize << ") expected value " << (sumValue) << ", got " << result[ndx] << "\n"
					<< "Work image contains invalid values."
					<< tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Work image contents are valid." << tcu::TestLog::EndMessage;
	}

	// verify steps
	{
		std::vector<std::vector<deUint32> >	intermediateResults	(m_numCalls);
		std::vector<deUint32>				valueChain			(m_numCalls);
		std::vector<deUint32>				chainDelta			(m_numCalls);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying intermediate results. " << tcu::TestLog::EndMessage;

		// collect results

		for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffers[callNdx]);
			readBuffer(gl, GL_SHADER_STORAGE_BUFFER, m_workSize * m_workSize, intermediateResults[callNdx]);
		}

		// verify values

		for (int valueNdx = 0; valueNdx < m_workSize; ++valueNdx)
		{
			int			invalidOperationNdx;
			deUint32	errorDelta;
			deUint32	errorExpected;

			// collect result chain for each element
			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				valueChain[callNdx] = intermediateResults[callNdx][valueNdx];

			// check there exists a path from 0 to sumValue using each addition once
			// decompose cumulative results to addition operations (all additions positive => this works)

			std::sort(valueChain.begin(), valueChain.end());

			for (int callNdx = 0; callNdx < m_numCalls; ++callNdx)
				chainDelta[callNdx] = ((callNdx + 1 == m_numCalls) ? (sumValue) : (valueChain[callNdx+1])) - valueChain[callNdx];

			// chainDelta contains now the actual additions applied to the value
			std::sort(chainDelta.begin(), chainDelta.end());

			// validate chain
			if (!validateSortedAtomicRampAdditionValueChain(valueChain, sumValue, invalidOperationNdx, errorDelta, errorExpected))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Intermediate buffer error, at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << "), applied operation index "
					<< invalidOperationNdx << ", value was increased by " << errorDelta << ", but expected " << errorExpected << ".\n"
					<< "Intermediate buffer contains invalid values. Values at index (" << valueNdx % m_workSize << ", " << valueNdx / m_workSize << ")\n"
					<< tcu::TestLog::EndMessage;

				for (int logCallNdx = 0; logCallNdx < m_numCalls; ++logCallNdx)
					m_testCtx.getLog() << tcu::TestLog::Message << "Value[" << logCallNdx << "] = " << intermediateResults[logCallNdx][valueNdx] << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Message << "Result = " << sumValue << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents invalid");
				return STOP;
			}
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Intermediate buffers are valid." << tcu::TestLog::EndMessage;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}